

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O0

void __thiscall Automaton::buildDefaultReduceActions(Automaton *this)

{
  bool bVar1;
  int iVar2;
  pointer pIVar3;
  size_type sVar4;
  pointer pSVar5;
  QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  int la;
  int size;
  ItemPointer item;
  ItemPointer def;
  StatePointer state;
  Item *in_stack_ffffffffffffff18;
  pointer in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff30;
  undefined3 uVar6;
  undefined4 in_stack_ffffffffffffff34;
  iterator *__x;
  int local_b4;
  _Self local_a8;
  _Self local_a0;
  _Self local_98;
  _Self local_90;
  _Self local_88;
  _Self local_80;
  _Self local_78;
  _Self local_70;
  undefined1 local_68 [96];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_70._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
  local_70._M_node =
       (_List_node_base *)
       std::__cxx11::list<State,_std::allocator<State>_>::begin
                 ((list<State,_std::allocator<State>_> *)in_stack_ffffffffffffff20);
  while( true ) {
    local_78._M_node =
         (_List_node_base *)
         std::__cxx11::list<State,_std::allocator<State>_>::end
                   ((list<State,_std::allocator<State>_> *)in_stack_ffffffffffffff20);
    bVar1 = std::operator!=(&local_70,&local_78);
    if (!bVar1) break;
    local_80._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
    std::_List_iterator<State>::operator->((_List_iterator<State> *)0x120486);
    local_80._M_node =
         (_List_node_base *)
         std::__cxx11::list<Item,_std::allocator<Item>_>::end
                   ((list<Item,_std::allocator<Item>_> *)in_stack_ffffffffffffff20);
    local_b4 = -1;
    local_88._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
    std::_List_iterator<State>::operator->((_List_iterator<State> *)0x1204b5);
    local_88._M_node =
         (_List_node_base *)
         std::__cxx11::list<Item,_std::allocator<Item>_>::begin
                   ((list<Item,_std::allocator<Item>_> *)in_stack_ffffffffffffff20);
    while( true ) {
      std::_List_iterator<State>::operator->((_List_iterator<State> *)0x1204d0);
      local_90._M_node =
           (_List_node_base *)
           std::__cxx11::list<Item,_std::allocator<Item>_>::end
                     ((list<Item,_std::allocator<Item>_> *)in_stack_ffffffffffffff20);
      bVar1 = std::operator!=(&local_88,&local_90);
      if (!bVar1) break;
      pIVar3 = std::_List_iterator<Item>::operator->((_List_iterator<Item> *)0x120503);
      __x = &pIVar3->dot;
      std::_List_iterator<Item>::operator->((_List_iterator<Item> *)0x120516);
      local_98._M_node = (_List_node_base *)Item::end_rhs(in_stack_ffffffffffffff18);
      bVar1 = std::operator!=(__x,&local_98);
      if (!bVar1) {
        memset(local_68,0,0x30);
        std::
        set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
        ::set((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
               *)0x12056c);
        QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
        ::value(in_RDI,(_List_iterator<Item> *)__x,
                (set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        sVar4 = std::
                set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                ::size((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                        *)0x120598);
        iVar2 = (int)sVar4;
        std::
        set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
        ::~set((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                *)0x1205a9);
        std::
        set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
        ::~set((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                *)0x1205b6);
        in_stack_ffffffffffffff30 = iVar2;
        std::_List_iterator<State>::operator->((_List_iterator<State> *)0x1205c8);
        local_a0._M_node =
             (_List_node_base *)
             std::__cxx11::list<Item,_std::allocator<Item>_>::end
                       ((list<Item,_std::allocator<Item>_> *)in_stack_ffffffffffffff20);
        bVar1 = std::operator==(&local_80,&local_a0);
        uVar6 = (undefined3)in_stack_ffffffffffffff34;
        in_stack_ffffffffffffff34 = CONCAT13(1,uVar6);
        if (!bVar1) {
          in_stack_ffffffffffffff34 = CONCAT13(local_b4 < iVar2,uVar6);
        }
        if ((char)((uint)in_stack_ffffffffffffff34 >> 0x18) != '\0') {
          local_80._M_node = local_88._M_node;
          local_b4 = iVar2;
        }
      }
      std::_List_iterator<Item>::operator++(&local_88);
    }
    std::_List_iterator<State>::operator->((_List_iterator<State> *)0x12063b);
    local_a8._M_node =
         (_List_node_base *)
         std::__cxx11::list<Item,_std::allocator<Item>_>::end
                   ((list<Item,_std::allocator<Item>_> *)in_stack_ffffffffffffff20);
    bVar1 = std::operator!=(&local_80,&local_a8);
    if (bVar1) {
      in_stack_ffffffffffffff20 =
           std::_List_iterator<Item>::operator->((_List_iterator<Item> *)0x12066b);
      pSVar5 = std::_List_iterator<State>::operator->((_List_iterator<State> *)0x12067a);
      (pSVar5->defaultReduce)._M_node = (in_stack_ffffffffffffff20->rule)._M_node;
    }
    std::_List_iterator<State>::operator++(&local_70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Automaton::buildDefaultReduceActions ()
{
  for (StatePointer state = states.begin (); state != states.end (); ++state)
    {
      ItemPointer def = state->closure.end ();
      int size = -1;

      for (ItemPointer item = state->closure.begin (); item != state->closure.end (); ++item)
        {
          if (item->dot != item->end_rhs ())
            continue;

          int la = static_cast<int>(lookaheads.value(item).size());
          if (def == state->closure.end () || la > size)
            {
              def = item;
              size = la;
            }
        }

      if (def != state->closure.end ())
        {
          Q_ASSERT (size >= 0);
          state->defaultReduce = def->rule;
        }
    }
}